

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_merge_sort_in_place(int **dst,size_t len)

{
  int *piVar1;
  int **dst1_00;
  int **dst_00;
  ulong uVar2;
  size_t len_00;
  int **in_RSI;
  int **in_RDI;
  int *_sort_swap_temp;
  size_t p0;
  size_t q1;
  size_t q;
  size_t m;
  size_t p;
  int **dst1;
  size_t lr;
  size_t r;
  size_t in_stack_ffffffffffffffa8;
  int **in_stack_ffffffffffffffb0;
  int **local_48;
  int **local_40;
  ulong in_stack_ffffffffffffffc8;
  int **dst2;
  int **dst2_00;
  int **dst2_01;
  
  dst1_00 = (int **)rbnd((size_t)in_RSI);
  dst_00 = (int **)(((ulong)in_RSI / (ulong)dst1_00 - 1) * (long)dst1_00);
  if ((int **)0x1 < in_RSI) {
    if (in_RSI < (int **)0x11) {
      stable_bitonic_sort(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    else {
      dst2_01 = in_RDI + -1;
      for (dst2 = (int **)0x2; dst2 <= dst_00; dst2 = (int **)((long)dst2 + 2)) {
        dst2_00 = dst2_01 + 2;
        if (**dst2_00 - *dst2_01[1] < 0) {
          piVar1 = *dst2_00;
          *dst2_00 = dst2_01[1];
          dst2_01[1] = piVar1;
        }
        if (((ulong)dst2 & 2) == 0) {
          in_stack_ffffffffffffffc8 = (long)in_RSI - (long)dst2;
          local_40 = (int **)0x2;
          while ((((ulong)dst2 & (ulong)local_40) == 0 &&
                 (-1 < *dst2_00[1 - (long)local_40] - *dst2_00[-(int)local_40]))) {
            local_40 = (int **)((long)local_40 << 1);
          }
          if (((ulong)dst2 & (ulong)local_40) == 0) {
            if (local_40 < in_stack_ffffffffffffffc8) {
              stable_merge_sort_in_place_aswap
                        (in_RDI + ((long)dst2 - (long)local_40),
                         in_RDI + ((long)in_RSI - (long)local_40),(size_t)local_40);
              while ((uVar2 = (long)local_40 * 2, uVar2 <= in_stack_ffffffffffffffc8 &&
                     (((ulong)dst2 & uVar2) == 0))) {
                stable_merge_sort_in_place_frontmerge
                          (dst_00,(size_t)dst2_00,dst2,in_stack_ffffffffffffffc8);
                local_40 = (int **)uVar2;
              }
              stable_merge_sort_in_place_backmerge(dst1_00,(size_t)dst_00,dst2_00,(size_t)dst2);
              local_40 = (int **)((long)local_40 << 1);
            }
            for (local_48 = local_40; in_stack_ffffffffffffffc8 < local_48;
                local_48 = (int **)((ulong)local_48 >> 1)) {
            }
            while (((ulong)local_40 & (ulong)dst2) == 0) {
              local_40 = (int **)((long)local_40 << 1);
              stable_merge_sort_in_place_rmerge
                        (dst_00,(size_t)dst2_00,(size_t)dst2,in_stack_ffffffffffffffc8);
            }
          }
        }
        dst2_01 = dst2_00;
      }
      local_48 = (int **)0x0;
      for (local_40 = dst1_00; local_40 < dst_00; local_40 = (int **)((long)local_40 << 1)) {
        if ((((ulong)dst_00 & (ulong)local_40) != 0) &&
           (local_48 = (int **)((long)local_40 + (long)local_48), local_48 != local_40)) {
          stable_merge_sort_in_place_rmerge
                    (dst_00,(size_t)dst2_01,(size_t)dst2,in_stack_ffffffffffffffc8);
        }
      }
      len_00 = (long)in_RSI - (long)dst_00;
      stable_merge_sort_in_place(in_RSI,(size_t)dst1_00);
      stable_merge_sort_in_place_aswap(in_RDI,in_RDI + (long)dst_00,len_00);
      stable_merge_sort_in_place_backmerge(dst1_00,(size_t)dst_00,dst2_01,(size_t)dst2);
      stable_merge_sort_in_place(in_RSI,(size_t)dst1_00);
    }
  }
  return;
}

Assistant:

void MERGE_SORT_IN_PLACE(SORT_TYPE *dst, const size_t len) {
  /* don't bother sorting an array of size <= 1 */
  size_t r = rbnd(len);
  size_t lr = (len / r - 1) * r;
  SORT_TYPE *dst1 = dst - 1;
  size_t p, m, q, q1, p0;

  if (len <= 1) {
    return;
  }

  if (len <= SMALL_SORT_BND) {
    SMALL_SORT(dst, len);
    return;
  }

  for (p = 2; p <= lr; p += 2) {
    dst1 += 2;

    if (SORT_CMP(dst1[0], dst1[-1]) < 0) {
      SORT_SWAP(dst1[0], dst1[-1]);
    }

    if (p & 2) {
      continue;
    }

    m = len - p;
    q = 2;

    while ((p & q) == 0) {
      if (SORT_CMP(dst1[1 - q], dst1[-(int)q]) < 0) {
        break;
      }

      q *= 2;
    }

    if (p & q) {
      continue;
    }

    if (q < m) {
      p0 = len - q;
      MERGE_SORT_IN_PLACE_ASWAP(dst + p - q, dst + p0, q);

      for (;;) {
        q1 = 2 * q;

        if ((q1 > m) || (p & q1)) {
          break;
        }

        p0 = len - q1;
        MERGE_SORT_IN_PLACE_FRONTMERGE(dst + (p - q1), q, dst + p0 + q, q);
        q = q1;
      }

      MERGE_SORT_IN_PLACE_BACKMERGE(dst + (len - 1), q, dst1 - q, q);
      q *= 2;
    }

    q1 = q;

    while (q1 > m) {
      q1 /= 2;
    }

    while ((q & p) == 0) {
      q *= 2;
      MERGE_SORT_IN_PLACE_RMERGE(dst + (p - q), q, q / 2, q1);
    }
  }

  q1 = 0;

  for (q = r; q < lr; q *= 2) {
    if ((lr & q) != 0) {
      q1 += q;

      if (q1 != q) {
        MERGE_SORT_IN_PLACE_RMERGE(dst + (lr - q1), q1, q, r);
      }
    }
  }

  m = len - lr;
  MERGE_SORT_IN_PLACE(dst + lr, m);
  MERGE_SORT_IN_PLACE_ASWAP(dst, dst + lr, m);
  m += MERGE_SORT_IN_PLACE_BACKMERGE(dst + (m - 1), m, dst + (lr - 1), lr - m);
  MERGE_SORT_IN_PLACE(dst, m);
}